

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

void flatbuffers::GenStruct
               (StructDef *struct_def,Table *table,int indent,int indent_step,string *_text)

{
  Value *pVVar1;
  BaseType BVar2;
  FieldDef *fd;
  EnumDef *this;
  double dVar3;
  Table val;
  byte bVar4;
  short val_00;
  unsigned_short val_01;
  int indent_00;
  int val_02;
  uint uVar5;
  long val_03;
  unsigned_long val_04;
  int iVar6;
  Table *val_05;
  pointer ppFVar7;
  undefined4 uVar8;
  float val_06;
  undefined4 uVar9;
  StructDef *local_48;
  
  std::__cxx11::string::append((char *)_text);
  std::__cxx11::string::append((char *)_text);
  ppFVar7 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  indent_00 = indent + indent_step;
  local_48 = (StructDef *)0x0;
  iVar6 = 0;
  do {
    if (ppFVar7 ==
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)_text);
      std::__cxx11::string::append((ulong)_text,(char)indent);
      std::__cxx11::string::append((char *)_text);
      return;
    }
    fd = *ppFVar7;
    if (struct_def->fixed == false) {
      uVar5 = (fd->value).offset;
      if (((ushort)uVar5 < *(ushort *)(table + -(long)*(int *)table)) &&
         (*(short *)(table + ((ulong)(uVar5 & 0xffff) - (long)*(int *)table)) != 0))
      goto LAB_001172d5;
    }
    else {
LAB_001172d5:
      if (iVar6 != 0) {
        std::__cxx11::string::append((char *)_text);
        std::__cxx11::string::append((char *)_text);
      }
      iVar6 = iVar6 + 1;
      std::__cxx11::string::append((ulong)_text,(char)indent_00);
      std::__cxx11::string::append((string *)_text);
      std::__cxx11::string::append((char *)_text);
      BVar2 = (fd->value).type.base_type;
      if (BVar2 < (BASE_TYPE_UNION|BASE_TYPE_UTYPE)) {
        pVVar1 = &fd->value;
        switch(BVar2) {
        default:
          GenField<unsigned_char>(fd,table,struct_def->fixed,indent_00,indent_step,_text);
          break;
        case BASE_TYPE_CHAR:
          uVar5 = (fd->value).offset;
          if (struct_def->fixed == true) {
            val = table[uVar5];
          }
          else {
            val = (Table)Table::GetField<signed_char>(table,(voffset_t)uVar5,'\0');
          }
          Print<signed_char>((char)val,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
          break;
        case BASE_TYPE_SHORT:
          uVar5 = (fd->value).offset;
          if (struct_def->fixed == true) {
            val_00 = *(short *)(table + uVar5);
          }
          else {
            val_00 = Table::GetField<short>(table,(voffset_t)uVar5,0);
          }
          Print<short>(val_00,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
          break;
        case BASE_TYPE_USHORT:
          uVar5 = (fd->value).offset;
          if (struct_def->fixed == true) {
            val_01 = *(unsigned_short *)(table + uVar5);
          }
          else {
            val_01 = Table::GetField<unsigned_short>(table,(voffset_t)uVar5,0);
          }
          Print<unsigned_short>(val_01,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
          break;
        case BASE_TYPE_INT:
          uVar5 = (fd->value).offset;
          if (struct_def->fixed == true) {
            val_02 = *(int *)(table + uVar5);
          }
          else {
            val_02 = Table::GetField<int>(table,(voffset_t)uVar5,0);
          }
          Print<int>(val_02,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
          break;
        case BASE_TYPE_UINT:
          uVar5 = (fd->value).offset;
          if (struct_def->fixed == true) {
            uVar5 = *(uint *)(table + uVar5);
          }
          else {
            uVar5 = Table::GetField<unsigned_int>(table,(voffset_t)uVar5,0);
          }
          Print<unsigned_int>(uVar5,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
          break;
        case BASE_TYPE_LONG:
          uVar5 = (fd->value).offset;
          if (struct_def->fixed == true) {
            val_03 = *(long *)(table + uVar5);
          }
          else {
            val_03 = Table::GetField<long>(table,(voffset_t)uVar5,0);
          }
          Print<long>(val_03,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
          break;
        case BASE_TYPE_ULONG:
          uVar5 = (fd->value).offset;
          if (struct_def->fixed == true) {
            val_04 = *(unsigned_long *)(table + uVar5);
          }
          else {
            val_04 = Table::GetField<unsigned_long>(table,(voffset_t)uVar5,0);
          }
          Print<unsigned_long>(val_04,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
          break;
        case BASE_TYPE_FLOAT:
          uVar5 = (fd->value).offset;
          if (struct_def->fixed == true) {
            val_06 = *(float *)(table + uVar5);
          }
          else {
            val_06 = Table::GetField<float>(table,(voffset_t)uVar5,0.0);
          }
          Print<float>(val_06,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
          break;
        case BASE_TYPE_DOUBLE:
          uVar5 = (fd->value).offset;
          if (struct_def->fixed == true) {
            uVar8 = (undefined4)*(undefined8 *)(table + uVar5);
            uVar9 = (undefined4)((ulong)*(undefined8 *)(table + uVar5) >> 0x20);
          }
          else {
            dVar3 = Table::GetField<double>(table,(voffset_t)uVar5,0.0);
            uVar8 = SUB84(dVar3,0);
            uVar9 = (undefined4)((ulong)dVar3 >> 0x20);
          }
          Print<double>((double)CONCAT44(uVar9,uVar8),pVVar1->type,indent_step,indent_00,
                        (StructDef *)0x0,_text);
          break;
        case BASE_TYPE_STRING:
        case BASE_TYPE_VECTOR:
        case BASE_TYPE_STRUCT:
        case BASE_TYPE_UNION:
          if (struct_def->fixed == true) {
            if ((BVar2 != BASE_TYPE_STRUCT) || (((fd->value).type.struct_def)->fixed == false)) {
              __assert_fail("IsStruct(fd.value.type)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_gen_text.cpp"
                            ,0x98,
                            "void flatbuffers::GenFieldOffset(const FieldDef &, const Table *, bool, int, int, StructDef *, std::string *)"
                           );
            }
            val_05 = table + (uint)(fd->value).offset;
          }
          else if ((BVar2 == BASE_TYPE_STRUCT) && (((fd->value).type.struct_def)->fixed == true)) {
            val_05 = (Table *)Table::GetStruct<void_const*>(table,(voffset_t)(fd->value).offset);
          }
          else {
            val_05 = (Table *)Table::GetPointer<void_const*>(table,(voffset_t)(fd->value).offset);
          }
          Print<void_const*>(val_05,pVVar1->type,indent_00,indent_step,local_48,_text);
        }
        if ((pVVar1->type).base_type == BASE_TYPE_UTYPE) {
          this = (fd->value).type.enum_def;
          bVar4 = Table::GetField<unsigned_char>(table,(voffset_t)(fd->value).offset,'\0');
          local_48 = EnumDef::ReverseLookup(this,(uint)bVar4);
        }
      }
    }
    ppFVar7 = ppFVar7 + 1;
  } while( true );
}

Assistant:

static void GenStruct(const StructDef &struct_def, const Table *table,
                      int indent, int indent_step, std::string *_text) {
  std::string &text = *_text;
  text += "{";
  text += NewLine(indent_step);
  int fieldout = 0;
  StructDef *union_sd = nullptr;
  for (auto it = struct_def.fields.vec.begin();
       it != struct_def.fields.vec.end();
       ++it) {
    FieldDef &fd = **it;
    if (struct_def.fixed || table->CheckField(fd.value.offset)) {
      // The field is present.
      if (fieldout++) {
        text += ",";
        text += NewLine(indent_step);
      }
      text.append(indent + indent_step, ' ');
      text += fd.name;
      text += ": ";
      switch (fd.value.type.base_type) {
         #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
           case BASE_TYPE_ ## ENUM: \
              GenField<CTYPE>(fd, table, struct_def.fixed, \
                              indent + indent_step, indent_step, _text); \
              break;
          FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
        // Generate drop-thru case statements for all pointer types:
        #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
          case BASE_TYPE_ ## ENUM:
          FLATBUFFERS_GEN_TYPES_POINTER(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
            GenFieldOffset(fd, table, struct_def.fixed, indent + indent_step,
                           indent_step, union_sd, _text);
            break;
      }
      if (fd.value.type.base_type == BASE_TYPE_UTYPE) {
        union_sd = fd.value.type.enum_def->ReverseLookup(
                                 table->GetField<uint8_t>(fd.value.offset, 0));
      }
    }
  }
  text += NewLine(indent_step);
  text.append(indent, ' ');
  text += "}";
}